

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

int __thiscall Assembler::processAbsoluteAddressingSymbol(Assembler *this,string *line)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
  *this_00;
  iterator iVar1;
  list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>> *plVar2;
  _Node *p_Var3;
  undefined8 *puVar4;
  int iVar5;
  char *__end;
  relocationTableEntry rT;
  string local_c0;
  string local_a0;
  undefined1 local_80 [48];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = &this->symbolTable;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
          ::find(&this_00->_M_t,line);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->symbolTable)._M_t._M_impl.super__Rb_tree_header) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = &PTR__exception_00130a78;
    __cxa_throw(puVar4,&NotDefSymbol::typeinfo,std::exception::~exception);
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
          ::find(&this_00->_M_t,line);
  if (iVar1._M_node[3]._M_color != ~_S_red) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"","");
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"","");
    relocationTableEntry::relocationTableEntry
              ((relocationTableEntry *)local_80,0,&local_a0,-1,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    local_80._0_4_ = locationCounter + local_80._0_4_ + 3;
    std::__cxx11::string::_M_replace((ulong)(local_80 + 8),0,(char *)local_80._16_8_,0x1242ea);
    std::__cxx11::string::_M_assign((string *)&local_50);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
            ::find(&this_00->_M_t,line);
    if ((*(char *)&iVar1._M_node[3]._M_parent == '\0') &&
       (iVar1 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
                ::find(&this_00->_M_t,line), iVar1._M_node[3]._M_color != _S_red)) {
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
              ::find(&this_00->_M_t,line);
      local_80._40_4_ = iVar1._M_node[3]._M_color;
      plVar2 = (list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
                  ::operator[](&this->relocationTable,&currentSectionName_abi_cxx11_);
      p_Var3 = std::__cxx11::
               list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>
               ::_M_create_node<Assembler::relocationTableEntry_const&>
                         (plVar2,(relocationTableEntry *)local_80);
      std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
      *(long *)(plVar2 + 0x10) = *(long *)(plVar2 + 0x10) + 1;
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
              ::find(&this_00->_M_t,line);
      iVar5 = *(int *)&iVar1._M_node[3].field_0x4;
    }
    else {
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
              ::find(&this_00->_M_t,line);
      local_80._40_4_ = *(undefined4 *)&iVar1._M_node[3]._M_left;
      plVar2 = (list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
                  ::operator[](&this->relocationTable,&currentSectionName_abi_cxx11_);
      p_Var3 = std::__cxx11::
               list<Assembler::relocationTableEntry,std::allocator<Assembler::relocationTableEntry>>
               ::_M_create_node<Assembler::relocationTableEntry_const&>
                         (plVar2,(relocationTableEntry *)local_80);
      std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
      *(long *)(plVar2 + 0x10) = *(long *)(plVar2 + 0x10) + 1;
      iVar5 = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_80._8_8_ != local_80 + 0x18) {
      operator_delete((void *)local_80._8_8_,local_80._24_8_ + 1);
    }
    return iVar5;
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
          ::find(&this_00->_M_t,line);
  return *(int *)&iVar1._M_node[3].field_0x4;
}

Assistant:

int Assembler::processAbsoluteAddressingSymbol(string line) {

    if (symbolTable.find(line) != symbolTable.end()) {
        if (symbolTable.find(line)->second.section == -1) return symbolTable.find(line)->second.value;
        else {
            relocationTableEntry rT = relocationTableEntry();
            rT.offset += locationCounter + 3;
            rT.typeOfRelocation = "R_386_16";
            rT.section = currentSectionName;

            if (symbolTable.find(line)->second.isGlobal || (symbolTable.find(line)->second.section == 0)) {
                rT.value = symbolTable.find(line)->second.id;
                relocationTable[currentSectionName].push_back(rT);
                return 0;
            } else {
                rT.value = symbolTable.find(line)->second.section;
                relocationTable[currentSectionName].push_back(rT);
                return symbolTable.find(line)->second.value;
            }
        }

    } else throw NotDefSymbol();
}